

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O1

_Bool tval_is_wearable(object *obj)

{
  return (byte)(obj->tval - 5) < 0x11;
}

Assistant:

bool tval_is_wearable(const struct object *obj)
{
	switch (obj->tval) {
		case TV_BOW:
		case TV_DIGGING:
		case TV_HAFTED:
		case TV_POLEARM:
		case TV_SWORD:
		case TV_BOOTS:
		case TV_GLOVES:
		case TV_HELM:
		case TV_CROWN:
		case TV_SHIELD:
		case TV_CLOAK:
		case TV_SOFT_ARMOR:
		case TV_HARD_ARMOR:
		case TV_DRAG_ARMOR:
		case TV_LIGHT:
		case TV_AMULET:
		case TV_RING:
			return true;
		default:
			return false;
	}
}